

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

int __thiscall gl4cts::GPUShaderFP64Test3::programInfo::init(programInfo *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var_00;
  TestError *pTVar7;
  undefined7 extraout_var;
  ostream *poVar8;
  pointer puVar9;
  GLchar *in_RCX;
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  *in_RDX;
  char *__to;
  GLchar *in_R8;
  GLchar *in_R9;
  GLchar *in_stack_00000008;
  GLchar *in_stack_00000010;
  string local_240 [36];
  value_type_conflict1 local_21c;
  value_type_conflict1 local_218;
  GLint matrix_stride;
  GLint offset;
  GLuint index;
  stringstream uniform_name_stream;
  ostream local_200;
  string local_88 [8];
  string uniform_name_str;
  GLchar *uniform_name;
  const_iterator end;
  const_iterator it;
  Functions *gl;
  GLchar *tesselation_control_shader_code_local;
  GLchar *geometry_shader_code_local;
  GLchar *fragment_shader_code_local;
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  *uniform_details_local;
  Context *context_local;
  programInfo *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((Context *)ctx);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var_00,iVar2);
  if (init(deqp::Context&,std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>>,char_const*,char_const*,char_const*,char_const*,char_const*)
      ::varying_names == '\0') {
    iVar2 = __cxa_guard_acquire(&init(deqp::Context&,std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>>,char_const*,char_const*,char_const*,char_const*,char_const*)
                                 ::varying_names);
    if (iVar2 != 0) {
      init::varying_names[0] = m_varying_name_gs_fs_gs_result;
      init::varying_names[1] = m_varying_name_gs_fs_tcs_result;
      init::varying_names[2] = m_varying_name_gs_fs_tes_result;
      init::varying_names[3] = m_varying_name_gs_fs_vs_result;
      __cxa_guard_release(&init(deqp::Context&,std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>>,char_const*,char_const*,char_const*,char_const*,char_const*)
                           ::varying_names);
    }
  }
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
  this->m_geometry_shader_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e88);
  this->m_tesselation_control_shader_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e87);
  this->m_tesselation_evaluation_shader_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1326);
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_program_object_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x132a);
  (**(code **)(lVar6 + 0x14c8))(this->m_program_object_id,4,init::varying_names,0x8c8c);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"TransformFeedbackVaryings",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x132e);
  compile(this,(Context *)ctx,this->m_fragment_shader_id,in_RCX);
  compile(this,(Context *)ctx,this->m_geometry_shader_id,in_R8);
  compile(this,(Context *)ctx,this->m_tesselation_control_shader_id,in_R9);
  compile(this,(Context *)ctx,this->m_tesselation_evaluation_shader_id,in_stack_00000008);
  compile(this,(Context *)ctx,this->m_vertex_shader_id,in_stack_00000010);
  link(this,(char *)ctx,__to);
  GVar3 = (**(code **)(lVar6 + 0xb38))(this->m_program_object_id,m_uniform_block_name);
  this->m_uniform_block_index = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x133d);
  if (this->m_uniform_block_index == 0xffffffff) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Unifom block is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x1341);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar6 + 0x760))
            (this->m_program_object_id,this->m_uniform_block_index,0x8a40,&this->m_buffer_size);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"GetActiveUniformBlockiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1346);
  if (this->m_buffer_size == 0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Unifom block size is 0",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x134a);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  end = std::
        vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
        ::begin(in_RDX);
  uniform_name = (GLchar *)
                 std::
                 vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                 ::end(in_RDX);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
                        *)&uniform_name,&end);
    if (!bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    uniform_name_str.field_2._8_8_ = 0;
    std::__cxx11::string::string(local_88);
    std::__cxx11::stringstream::stringstream((stringstream *)&offset);
    matrix_stride = 0;
    local_218 = 0;
    local_21c = 0;
    poVar8 = std::operator<<(&local_200,m_uniform_block_name);
    poVar8 = std::operator<<(poVar8,".");
    puVar9 = __gnu_cxx::
             __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
             ::operator->(&end);
    std::operator<<(poVar8,puVar9->m_name);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_88,local_240);
    std::__cxx11::string::~string(local_240);
    uniform_name_str.field_2._8_8_ = std::__cxx11::string::c_str();
    (**(code **)(lVar6 + 0xb40))
              (this->m_program_object_id,1,(undefined1 *)((long)&uniform_name_str.field_2 + 8),
               &matrix_stride);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"GetUniformIndices",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1360);
    if (matrix_stride == -1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unifom is inactive",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x1364);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar6 + 0x770))(this->m_program_object_id,1,&matrix_stride,0x8a3b,&local_218);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"GetActiveUniformsiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1369);
    if (local_218 == -1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unifom has invalid offset",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x136d);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_uniform_offsets,&local_218);
    (**(code **)(lVar6 + 0x770))(this->m_program_object_id,1,&matrix_stride,0x8a3d,&local_21c);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"GetActiveUniformsiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1374);
    if (local_218 == -1) break;
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_uniform_matrix_strides,&local_21c);
    std::__cxx11::stringstream::~stringstream((stringstream *)&offset);
    std::__cxx11::string::~string(local_88);
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test3::uniformDetails_*,_std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>_>
    ::operator++(&end);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Unifom has invalid matrix stride",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x1378);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GPUShaderFP64Test3::programInfo::init(deqp::Context& context, const std::vector<uniformDetails> uniform_details,
										   const glw::GLchar* fragment_shader_code,
										   const glw::GLchar* geometry_shader_code,
										   const glw::GLchar* tesselation_control_shader_code,
										   const glw::GLchar* tesselation_evaluation_shader_code,
										   const glw::GLchar* vertex_shader_code)
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Names of varyings to be captured with transform feedback */
	static const glw::GLchar* varying_names[] = { m_varying_name_gs_fs_gs_result, m_varying_name_gs_fs_tcs_result,
												  m_varying_name_gs_fs_tes_result, m_varying_name_gs_fs_vs_result };
	static const glw::GLuint n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	/* Create shader objects */
	m_fragment_shader_id			   = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id			   = gl.createShader(GL_GEOMETRY_SHADER);
	m_tesselation_control_shader_id	= gl.createShader(GL_TESS_CONTROL_SHADER);
	m_tesselation_evaluation_shader_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vertex_shader_id				   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	/* Create program object */
	m_program_object_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	/* Set up names of varyings to be captured with transform feedback */
	gl.transformFeedbackVaryings(m_program_object_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TransformFeedbackVaryings");

	/* Compile shaders */
	compile(context, m_fragment_shader_id, fragment_shader_code);
	compile(context, m_geometry_shader_id, geometry_shader_code);
	compile(context, m_tesselation_control_shader_id, tesselation_control_shader_code);
	compile(context, m_tesselation_evaluation_shader_id, tesselation_evaluation_shader_code);
	compile(context, m_vertex_shader_id, vertex_shader_code);

	/* Link program */
	link(context);

	/* Inspect program object */
	/* Get index of named uniform block */
	m_uniform_block_index = gl.getUniformBlockIndex(m_program_object_id, m_uniform_block_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");

	if (GL_INVALID_INDEX == m_uniform_block_index)
	{
		TCU_FAIL("Unifom block is inactive");
	}

	/* Get size of named uniform block */
	gl.getActiveUniformBlockiv(m_program_object_id, m_uniform_block_index, GL_UNIFORM_BLOCK_DATA_SIZE, &m_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (0 == m_buffer_size)
	{
		TCU_FAIL("Unifom block size is 0");
	}

	/* Get information about "double precision" uniforms */
	for (std::vector<uniformDetails>::const_iterator it = uniform_details.begin(), end = uniform_details.end();
		 end != it; ++it)
	{
		const glw::GLchar* uniform_name = 0;
		std::string		   uniform_name_str;
		std::stringstream  uniform_name_stream;
		glw::GLuint		   index		 = 0;
		glw::GLint		   offset		 = 0;
		glw::GLint		   matrix_stride = 0;

		/* Uniform name = UNIFORM_BLOCK_NAME.UNIFORM_NAME */
		uniform_name_stream << m_uniform_block_name << "." << it->m_name;

		uniform_name_str = uniform_name_stream.str();
		uniform_name	 = uniform_name_str.c_str();

		/* Get index of uniform */
		gl.getUniformIndices(m_program_object_id, 1 /* count */, &uniform_name, &index);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformIndices");

		if (GL_INVALID_INDEX == index)
		{
			TCU_FAIL("Unifom is inactive");
		}

		/* Get offset of uniform */
		gl.getActiveUniformsiv(m_program_object_id, 1 /* count */, &index, GL_UNIFORM_OFFSET, &offset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

		if (m_invalid_uniform_offset == offset)
		{
			TCU_FAIL("Unifom has invalid offset");
		}

		m_uniform_offsets.push_back(offset);

		/* Get matrix stride of uniform */
		gl.getActiveUniformsiv(m_program_object_id, 1 /* count */, &index, GL_UNIFORM_MATRIX_STRIDE, &matrix_stride);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

		if (m_invalid_uniform_matrix_stride == offset)
		{
			TCU_FAIL("Unifom has invalid matrix stride");
		}

		m_uniform_matrix_strides.push_back(matrix_stride);
	}
}